

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_viewer.c
# Opt level: O2

void oonf_viewer_print_help
               (autobuf *out,char *parameter,oonf_viewer_template *template,size_t count)

{
  abuf_template_data *paVar1;
  abuf_template_data **ppaVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  abuf_template_data **ppaVar7;
  char **ppcVar8;
  long lVar9;
  bool bVar10;
  
  if ((parameter == (char *)0x0) || (*parameter == '\0')) {
    abuf_puts(out,"Available subcommands:\n");
    ppcVar8 = &template->help_line;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      if (*ppcVar8 == (char *)0x0) {
        abuf_appendf(out,"\t%s\n",ppcVar8[-1]);
      }
      else {
        abuf_appendf(out,"\t%s: %s\n",ppcVar8[-1]);
      }
      ppcVar8 = ppcVar8 + 0xb;
    }
    abuf_puts(out,
              "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
             );
    pcVar4 = "Use \'help <command> <subcommand>\' to get help about a subcommand\n";
  }
  else {
    lVar9 = count + 1;
    ppaVar2 = &template[-1].data;
    do {
      ppaVar7 = ppaVar2;
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) {
        abuf_appendf(out,"Unknown subcommand %s\n",parameter);
        return;
      }
      pcVar4 = (char *)ppaVar7[0xd];
      iVar3 = strcmp(parameter,pcVar4);
      ppaVar2 = ppaVar7 + 0xb;
    } while (iVar3 != 0);
    if (ppaVar7[0xf] != (abuf_template_data *)0x0) {
      abuf_puts(out);
      pcVar4 = (char *)ppaVar7[0xd];
    }
    abuf_appendf(out,"The subcommand \'%s\' has the following keys:\n",pcVar4);
    for (uVar6 = 0; uVar6 < ppaVar7[0xc]; uVar6 = uVar6 + 1) {
      lVar9 = 0;
      for (uVar5 = 0; paVar1 = ppaVar7[0xb], uVar5 < paVar1[uVar6].count; uVar5 = uVar5 + 1) {
        abuf_appendf(out,"\t%%%s%%\n",*(undefined8 *)((long)&(paVar1[uVar6].data)->key + lVar9));
        lVar9 = lVar9 + 0x18;
      }
    }
    pcVar4 = 
    "\nUse \'json\' as the first parameter \' to generate JSON output of all keys/value pairs.\nUse \'jsonraw\' as the first parameter to generate JSON output of all keys/value pairs  without isoprefixes for numbers.\nUse \'head\' as the first parameter to generate a headline for the table.\nUse \'raw\' as the first parameter to generate a headline for the table without isoprefixes for numbers.\nYou can also add a custom template (text with keys inside) as the last parameter instead.\n"
    ;
  }
  abuf_puts(out,pcVar4);
  return;
}

Assistant:

void
oonf_viewer_print_help(
  struct autobuf *out, const char *parameter, struct oonf_viewer_template *template, size_t count) {
  size_t i, j, k;

  if (parameter == NULL || *parameter == 0) {
    abuf_puts(out, "Available subcommands:\n");

    for (i = 0; i < count; i++) {
      if (template[i].help_line) {
        abuf_appendf(out, "\t%s: %s\n", template[i].json_name, template[i].help_line);
      }
      else {
        abuf_appendf(out, "\t%s\n", template[i].json_name);
      }
    }

    abuf_puts(out, _telnet_help);
    abuf_puts(out, "Use 'help <command> <subcommand>' to get help about a subcommand\n");
    return;
  }
  for (i = 0; i < count; i++) {
    if (strcmp(parameter, template[i].json_name) == 0) {
      if (template[i].help) {
        abuf_puts(out, template[i].help);
      }
      abuf_appendf(out, "The subcommand '%s' has the following keys:\n", template[i].json_name);

      for (j = 0; j < template[i].data_size; j++) {
        for (k = 0; k < template[i].data[j].count; k++) {
          abuf_appendf(out, "\t%%%s%%\n", template[i].data[j].data[k].key);
        }
      }

      abuf_puts(out, _telnet_help);
      return;
    }
  }

  abuf_appendf(out, "Unknown subcommand %s\n", parameter);
}